

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

int libssh2_agent_sign(LIBSSH2_AGENT *agent,libssh2_agent_publickey *identity,uchar **sig,
                      size_t *s_len,uchar *data,size_t d_len,char *method,uint method_len)

{
  uint32_t uVar1;
  int iVar2;
  undefined8 uVar3;
  uint32_t methodLen;
  int rc;
  void *abstract;
  size_t d_len_local;
  uchar *data_local;
  size_t *s_len_local;
  uchar **sig_local;
  libssh2_agent_publickey *identity_local;
  LIBSSH2_AGENT *agent_local;
  
  _methodLen = agent;
  abstract = (void *)d_len;
  d_len_local = (size_t)data;
  data_local = (uchar *)s_len;
  s_len_local = (size_t *)sig;
  sig_local = (uchar **)identity;
  identity_local = (libssh2_agent_publickey *)agent;
  if (agent->session->userauth_pblc_state == libssh2_NB_state_idle) {
    memset(&agent->transctx,0,0x30);
    identity_local[1].comment = (char *)sig_local[1];
  }
  if (sig_local[3] < (uchar *)0x4) {
    agent_local._4_4_ = -0x26;
  }
  else {
    uVar1 = _libssh2_ntohu32(sig_local[2]);
    if (sig_local[3] < (uchar *)((ulong)uVar1 + 4)) {
      agent_local._4_4_ = -0x26;
    }
    else {
      *(ulong *)(*(long *)identity_local + 0x13938) = (ulong)method_len;
      uVar3 = (**(code **)(*(long *)identity_local + 8))(method_len,*(undefined8 *)identity_local);
      *(undefined8 *)(*(long *)identity_local + 0x13930) = uVar3;
      memcpy(*(void **)(*(long *)identity_local + 0x13930),method,(ulong)uVar1);
      iVar2 = agent_sign(*(LIBSSH2_SESSION **)identity_local,(uchar **)s_len_local,
                         (size_t *)data_local,(uchar *)d_len_local,(size_t)abstract,
                         (void **)&methodLen);
      (**(code **)(*(long *)identity_local + 0x18))
                (*(undefined8 *)(*(long *)identity_local + 0x13930),*(undefined8 *)identity_local);
      *(undefined8 *)(*(long *)identity_local + 0x13930) = 0;
      *(undefined8 *)(*(long *)identity_local + 0x13938) = 0;
      agent_local._4_4_ = iVar2;
    }
  }
  return agent_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_agent_sign(LIBSSH2_AGENT *agent,
                   struct libssh2_agent_publickey *identity,
                   unsigned char **sig,
                   size_t *s_len,
                   const unsigned char *data,
                   size_t d_len,
                   const char *method,
                   unsigned int method_len)
{
    void *abstract = agent;
    int rc;
    uint32_t methodLen;

    if(agent->session->userauth_pblc_state == libssh2_NB_state_idle) {
        memset(&agent->transctx, 0, sizeof(agent->transctx));
        agent->identity = identity->node;
    }

    if(identity->blob_len < sizeof(uint32_t)) {
        return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
    }

    methodLen = _libssh2_ntohu32(identity->blob);

    if(identity->blob_len < sizeof(uint32_t) + methodLen) {
        return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
    }

    agent->session->userauth_pblc_method_len = method_len;
    agent->session->userauth_pblc_method = LIBSSH2_ALLOC(agent->session,
                                                         method_len);

    memcpy(agent->session->userauth_pblc_method, method, methodLen);

    rc = agent_sign(agent->session, sig, s_len, data, d_len, &abstract);

    LIBSSH2_FREE(agent->session, agent->session->userauth_pblc_method);
    agent->session->userauth_pblc_method = NULL;
    agent->session->userauth_pblc_method_len = 0;

    return rc;
}